

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs2d_dpb.c
# Opt level: O0

MPP_RET avs2d_dpb_insert(Avs2dCtx_t *p_dec,HalDecTask *task)

{
  Avs2dFrame_t *pAVar1;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  RK_S32 local_4c;
  Avs2dFrame_t *tmp;
  Avs2dFrameMgr_t *mgr;
  Avs2dFrame_t *p;
  RK_U32 i;
  MPP_RET ret;
  HalDecTask *task_local;
  Avs2dCtx_t *p_dec_local;
  
  if ((avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_dpb","In.","avs2d_dpb_insert");
  }
  compute_frame_order_index(p_dec);
  dpb_output_next_frame(p_dec,1);
  dpb_remove_scene_frame(p_dec);
  dpb_remove_unused_frame(p_dec);
  pAVar1 = dpb_alloc_frame(p_dec,task);
  p_dec->frame_no = p_dec->frame_no + 1;
  if ((avs2d_parse_debug & 0x40) != 0) {
    _mpp_log_l(4,"avs2d_dpb","get unused frame from dpb %d","avs2d_dpb_insert",
               (ulong)(uint)pAVar1->slot_idx);
  }
  if (pAVar1 == (Avs2dFrame_t *)0x0) {
    p._4_4_ = MPP_ERR_NOMEM;
    _mpp_log_l(2,"avs2d_dpb","Failed to alloc dpb frame.\n",(char *)0x0);
  }
  else {
    (p_dec->frm_mgr).cur_frm = pAVar1;
    mpp_buf_slot_set_prop(p_dec->frame_slots,pAVar1->slot_idx,SLOT_FRAME,pAVar1->frame);
    mpp_buf_slot_set_flag(p_dec->frame_slots,pAVar1->slot_idx,SLOT_CODEC_USE);
    mpp_buf_slot_set_flag(p_dec->frame_slots,pAVar1->slot_idx,SLOT_HAL_OUTPUT);
    task->output = ((p_dec->frm_mgr).cur_frm)->slot_idx;
    if ((avs2d_parse_debug & 0x40) != 0) {
      _mpp_log_l(4,"avs2d_dpb","curframe slot_idx %d\n","avs2d_dpb_insert",
                 (ulong)(uint)((p_dec->frm_mgr).cur_frm)->slot_idx);
    }
    p._4_4_ = dpb_set_frame_refs(p_dec,&p_dec->frm_mgr,task);
    if (p._4_4_ != MPP_OK) {
      (task->flags).val = (task->flags).val & 0xfffffffffffffff7;
    }
    for (p._0_4_ = 0; (uint)p < (p_dec->frm_mgr).num_of_ref; p._0_4_ = (uint)p + 1) {
      if ((p_dec->frm_mgr).refs[(uint)p] == (Avs2dFrame_t *)0x0) {
        local_4c = -1;
      }
      else {
        local_4c = (p_dec->frm_mgr).refs[(uint)p]->slot_idx;
      }
      task->refer[(uint)p] = local_4c;
      if ((p_dec->frm_mgr).refs[(uint)p] == (Avs2dFrame_t *)0x0) {
        task->refer[(uint)p] = -1;
        if ((avs2d_parse_debug & 0x40) != 0) {
          _mpp_log_l(4,"avs2d_dpb","task refer[%d] missing ref\n","avs2d_dpb_insert",(ulong)(uint)p)
          ;
        }
      }
      else {
        task->refer[(uint)p] = (p_dec->frm_mgr).refs[(uint)p]->slot_idx;
        if ((avs2d_parse_debug & 0x40) != 0) {
          _mpp_log_l(4,"avs2d_dpb","task refer[%d] slot_idx %d doi %d poi %d","avs2d_dpb_insert",
                     (ulong)(uint)p,(ulong)(uint)task->refer[(uint)p],
                     (p_dec->frm_mgr).refs[(uint)p]->doi,(p_dec->frm_mgr).refs[(uint)p]->poi);
        }
      }
    }
    dpb_update_refs(p_dec);
    if ((avs2d_parse_debug & 0x40) != 0) {
      _mpp_log_l(4,"avs2d_dpb","--------DPB INFO--------","avs2d_dpb_insert");
    }
    if ((avs2d_parse_debug & 0x40) != 0) {
      _mpp_log_l(4,"avs2d_dpb","dpb_idx slt_idx doi poi type out refered\n","avs2d_dpb_insert");
    }
    for (p._0_4_ = 0; (uint)p < (p_dec->frm_mgr).dpb_size; p._0_4_ = (uint)p + 1) {
      pAVar1 = (p_dec->frm_mgr).dpb[(uint)p];
      if ((avs2d_parse_debug & 0x40) != 0) {
        if (pAVar1->picture_type == I_PICTURE) {
          local_60 = 0x49;
        }
        else {
          if (pAVar1->picture_type == P_PICTURE) {
            local_64 = 0x50;
          }
          else {
            if (pAVar1->picture_type == B_PICTURE) {
              local_68 = 0x42;
            }
            else {
              if (pAVar1->picture_type == F_PICTURE) {
                local_6c = 0x46;
              }
              else {
                if (pAVar1->picture_type == G_PICTURE) {
                  local_70 = 0x47;
                }
                else {
                  if (pAVar1->picture_type == GB_PICTURE) {
                    local_74 = 0x67;
                  }
                  else {
                    local_74 = 0x45;
                    if (pAVar1->picture_type == S_PICTURE) {
                      local_74 = 0x53;
                    }
                  }
                  local_70 = local_74;
                }
                local_6c = local_70;
              }
              local_68 = local_6c;
            }
            local_64 = local_68;
          }
          local_60 = local_64;
        }
        _mpp_log_l(4,"avs2d_dpb","%02d      %02d      %02d  %02d  %c    %d   %d","avs2d_dpb_insert",
                   (ulong)(uint)p,(ulong)(uint)pAVar1->slot_idx,pAVar1->doi,pAVar1->poi,local_60,
                   (uint)pAVar1->is_output,
                   (uint)(pAVar1->refered_by_others | pAVar1->refered_by_scene));
      }
    }
    if ((avs2d_parse_debug & 0x40) != 0) {
      _mpp_log_l(4,"avs2d_dpb","------------------------","avs2d_dpb_insert");
    }
  }
  if ((avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_dpb","Out.","avs2d_dpb_insert");
  }
  return p._4_4_;
}

Assistant:

MPP_RET avs2d_dpb_insert(Avs2dCtx_t *p_dec, HalDecTask *task)
{
    MPP_RET ret = MPP_OK;
    RK_U32 i;
    Avs2dFrame_t *p;
    Avs2dFrameMgr_t *mgr = &p_dec->frm_mgr;

    AVS2D_PARSE_TRACE("In.");

    compute_frame_order_index(p_dec);

    //!< output frame from dpb
    dpb_output_next_frame(p_dec, 1);

    //!< remove scene(G/GB) frame(scene dbp has only one G/GB)
    dpb_remove_scene_frame(p_dec);

    //!< remove unused dpb frame
    dpb_remove_unused_frame(p_dec);

    //!< set task with new frame
    p = dpb_alloc_frame(p_dec, task);
    p_dec->frame_no++;
    avs2d_dbg_dpb("get unused frame from dpb %d", p->slot_idx);
    if (!p) {
        ret = MPP_ERR_NOMEM;
        mpp_err("Failed to alloc dpb frame.\n");
        goto __FAILED;
    }

    mgr->cur_frm = p;
    mpp_buf_slot_set_prop(p_dec->frame_slots, p->slot_idx, SLOT_FRAME, p->frame);
    mpp_buf_slot_set_flag(p_dec->frame_slots, p->slot_idx, SLOT_CODEC_USE);
    mpp_buf_slot_set_flag(p_dec->frame_slots, p->slot_idx, SLOT_HAL_OUTPUT);

    //!< set task output
    task->output = mgr->cur_frm->slot_idx;
    avs2d_dbg_dpb("curframe slot_idx %d\n", mgr->cur_frm->slot_idx);

    //!< set task refers
    ret = dpb_set_frame_refs(p_dec, mgr, task);
    if (ret)
        task->flags.ref_err = 0;

    for (i = 0; i < mgr->num_of_ref; i++) {
        task->refer[i] = mgr->refs[i] ? mgr->refs[i]->slot_idx : -1;
        if (mgr->refs[i]) {
            task->refer[i] = mgr->refs[i]->slot_idx;
            avs2d_dbg_dpb("task refer[%d] slot_idx %d doi %d poi %d", i, task->refer[i], mgr->refs[i]->doi, mgr->refs[i]->poi);
        } else {
            task->refer[i] = -1;
            avs2d_dbg_dpb("task refer[%d] missing ref\n", i);
        }
    }

    //!< update dpb by rps
    dpb_update_refs(p_dec);

    avs2d_dbg_dpb("--------DPB INFO--------");
    avs2d_dbg_dpb("dpb_idx slt_idx doi poi type out refered\n");
    Avs2dFrame_t *tmp;
    for (i = 0; i < mgr->dpb_size; i++) {
        tmp = mgr->dpb[i];
        avs2d_dbg_dpb("%02d      %02d      %02d  %02d  %c    %d   %d",
                      i, tmp->slot_idx, tmp->doi, tmp->poi, PICTURE_TYPE_TO_CHAR(tmp->picture_type),
                      tmp->is_output, tmp->refered_by_others | tmp->refered_by_scene);
    }
    avs2d_dbg_dpb("------------------------");

__FAILED:
    AVS2D_PARSE_TRACE("Out.");
    return ret;
}